

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upcast_test.cc
# Opt level: O2

void intgemm::kernel_upcast8to32_test<(intgemm::CPUType)4>(void)

{
  vector_t<CPUType::AVX512BW,_int> input_00;
  vector_t<CPUType::AVX512BW,_int> input_01;
  size_t sVar1;
  long lVar2;
  ulong uVar3;
  AlignedVector<signed_char> input;
  AlignedVector<int> output;
  dvector_t<(intgemm::CPUType)4,_int> result32b;
  dvector_t<(intgemm::CPUType)4,_int> result32a;
  dvector_t<(intgemm::CPUType)4,_short> result16;
  AlignedVector<signed_char> local_278;
  AlignedVector<int> local_260;
  StringRef local_250;
  longlong local_240;
  longlong lStack_238;
  longlong lStack_230;
  longlong lStack_228;
  longlong lStack_220;
  longlong lStack_218;
  longlong lStack_210;
  longlong lStack_208;
  dvector_t<(intgemm::CPUType)4,_int> local_200;
  dvector_t<(intgemm::CPUType)4,_int> local_180;
  dvector_t<(intgemm::CPUType)4,_short> local_100;
  
  if (3 < kCPU) {
    AlignedVector<signed_char>::AlignedVector(&local_278,0x40,0x40);
    AlignedVector<int>::AlignedVector(&local_260,0x40,0x40);
    for (sVar1 = 0; local_278.size_ != sVar1; sVar1 = sVar1 + 1) {
      *(char *)((long)(longlong *)local_278.mem_ + sVar1) = (char)sVar1 + -0x20;
    }
    local_180.first[0] = *(longlong *)local_278.mem_;
    local_180.first[1] = ((longlong *)local_278.mem_)[1];
    local_180.first[2] = ((longlong *)local_278.mem_)[2];
    local_180.first[3] = ((longlong *)local_278.mem_)[3];
    local_180.first[4] = ((longlong *)local_278.mem_)[4];
    local_180.first[5] = ((longlong *)local_278.mem_)[5];
    local_180.first[6] = ((longlong *)local_278.mem_)[6];
    local_180.first[7] = ((longlong *)local_278.mem_)[7];
    kernels::upcast8to16(&local_100,*(vector_t<CPUType::AVX512BW,_int> *)local_278.mem_);
    local_200.first[0] = local_100.first[0];
    local_200.first[1] = local_100.first[1];
    local_200.first[2] = local_100.first[2];
    local_200.first[3] = local_100.first[3];
    local_200.first[4] = local_100.first[4];
    local_200.first[5] = local_100.first[5];
    local_200.first[6] = local_100.first[6];
    local_200.first[7] = local_100.first[7];
    input_00[1] = local_100.first[1];
    input_00[0] = local_100.first[0];
    input_00[2] = local_100.first[2];
    input_00[3] = local_100.first[3];
    input_00[4] = local_100.first[4];
    input_00[5] = local_100.first[5];
    input_00[6] = local_100.first[6];
    input_00[7] = local_100.first[7];
    kernels::upcast16to32(&local_180,input_00);
    local_240 = local_100.second[0];
    lStack_238 = local_100.second[1];
    lStack_230 = local_100.second[2];
    lStack_228 = local_100.second[3];
    lStack_220 = local_100.second[4];
    lStack_218 = local_100.second[5];
    lStack_210 = local_100.second[6];
    lStack_208 = local_100.second[7];
    input_01[1] = local_100.second[1];
    input_01[0] = local_100.second[0];
    input_01[2] = local_100.second[2];
    input_01[3] = local_100.second[3];
    input_01[4] = local_100.second[4];
    input_01[5] = local_100.second[5];
    input_01[6] = local_100.second[6];
    input_01[7] = local_100.second[7];
    kernels::upcast16to32(&local_200,input_01);
    *(longlong *)local_260.mem_ = local_180.first[0];
    *(longlong *)((long)local_260.mem_ + 8) = local_180.first[1];
    *(longlong *)((long)local_260.mem_ + 0x10) = local_180.first[2];
    *(longlong *)((long)local_260.mem_ + 0x18) = local_180.first[3];
    *(longlong *)((long)local_260.mem_ + 0x20) = local_180.first[4];
    *(longlong *)((long)local_260.mem_ + 0x28) = local_180.first[5];
    *(longlong *)((long)local_260.mem_ + 0x30) = local_180.first[6];
    *(longlong *)((long)local_260.mem_ + 0x38) = local_180.first[7];
    *(longlong *)((long)local_260.mem_ + 0x40) = local_180.second[0];
    *(longlong *)((long)local_260.mem_ + 0x48) = local_180.second[1];
    *(longlong *)((long)local_260.mem_ + 0x50) = local_180.second[2];
    *(longlong *)((long)local_260.mem_ + 0x58) = local_180.second[3];
    *(longlong *)((long)local_260.mem_ + 0x60) = local_180.second[4];
    *(longlong *)((long)local_260.mem_ + 0x68) = local_180.second[5];
    *(longlong *)((long)local_260.mem_ + 0x70) = local_180.second[6];
    *(longlong *)((long)local_260.mem_ + 0x78) = local_180.second[7];
    *(longlong *)((long)local_260.mem_ + 0x80) = local_200.first[0];
    *(longlong *)((long)local_260.mem_ + 0x88) = local_200.first[1];
    *(longlong *)((long)local_260.mem_ + 0x90) = local_200.first[2];
    *(longlong *)((long)local_260.mem_ + 0x98) = local_200.first[3];
    *(longlong *)((long)local_260.mem_ + 0xa0) = local_200.first[4];
    *(longlong *)((long)local_260.mem_ + 0xa8) = local_200.first[5];
    *(longlong *)((long)local_260.mem_ + 0xb0) = local_200.first[6];
    *(longlong *)((long)local_260.mem_ + 0xb8) = local_200.first[7];
    *(longlong *)((long)local_260.mem_ + 0xc0) = local_200.second[0];
    *(longlong *)((long)local_260.mem_ + 200) = local_200.second[1];
    *(longlong *)((long)local_260.mem_ + 0xd0) = local_200.second[2];
    *(longlong *)((long)local_260.mem_ + 0xd8) = local_200.second[3];
    *(longlong *)((long)local_260.mem_ + 0xe0) = local_200.second[4];
    *(longlong *)((long)local_260.mem_ + 0xe8) = local_200.second[5];
    *(longlong *)((long)local_260.mem_ + 0xf0) = local_200.second[6];
    *(longlong *)((long)local_260.mem_ + 0xf8) = local_200.second[7];
    lVar2 = 0;
    for (uVar3 = 0; uVar3 < local_260.size_; uVar3 = uVar3 + 1) {
      local_180.first[0] = 0x18fab9;
      local_180.first[1] = 5;
      local_200.first[0] = 0x196240;
      local_200.first[1] = 0x65;
      Catch::StringRef::StringRef(&local_250,"output[i] == int32_t(input[i])");
      Catch::AssertionHandler::AssertionHandler
                ((AssertionHandler *)&local_100,(StringRef *)&local_180,(SourceLineInfo *)&local_200
                 ,local_250,ContinueOnFailure);
      local_200.first[0] = (long)local_260.mem_ + lVar2;
      local_240 = CONCAT44(local_240._4_4_,(int)*(char *)((long)(longlong *)local_278.mem_ + uVar3))
      ;
      Catch::ExprLhs<int_const&>::operator==
                ((BinaryExpr<const_int_&,_const_int_&> *)&local_180,
                 (ExprLhs<int_const&> *)&local_200,(int *)&local_240);
      Catch::AssertionHandler::handleExpr
                ((AssertionHandler *)&local_100,(ITransientExpression *)&local_180);
      Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)&local_180);
      Catch::AssertionHandler::complete((AssertionHandler *)&local_100);
      Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&local_100);
      lVar2 = lVar2 + 4;
    }
    free(local_260.mem_);
    free(local_278.mem_);
  }
  return;
}

Assistant:

void kernel_upcast8to32_test() {
  if (kCPU < CPUType_)
    return;

  using vi = vector_t<CPUType_, int>;
  constexpr int LENGTH = sizeof(vi) / sizeof(int8_t);

  AlignedVector<int8_t> input(LENGTH);
  AlignedVector<int32_t> output(LENGTH);

  std::iota(input.begin(), input.end(), static_cast<int8_t>(-LENGTH / 2));

  auto result = kernels::upcast8to32(*input.template as<vi>());
  output.template as<vi>()[0] = result.first;
  output.template as<vi>()[1] = result.second;
  output.template as<vi>()[2] = result.third;
  output.template as<vi>()[3] = result.fourth;

  for (std::size_t i = 0; i < output.size(); ++i)
    CHECK(output[i] == int32_t(input[i]));
}